

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

void string_buffer_appendf(string_buffer_t *sb,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (sb != (string_buffer_t *)0x0) {
    if (fmt == (char *)0x0) {
      __assert_fail("fmt != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                    ,0x16d,"void string_buffer_appendf(string_buffer_t *, const char *, ...)");
    }
    __s = (char *)malloc(0x10);
    local_f8 = local_e8;
    local_108 = 0x3000000010;
    local_100 = &args[0].overflow_arg_area;
    iVar1 = vsnprintf(__s,0x10,fmt,&local_108);
    if (0xf < iVar1) {
      free(__s);
      uVar2 = iVar1 + 1;
      __s = (char *)malloc((ulong)uVar2);
      local_108 = 0x3000000010;
      local_f8 = local_e8;
      local_100 = &args[0].overflow_arg_area;
      iVar1 = vsnprintf(__s,(ulong)uVar2,fmt,&local_108);
      if ((int)uVar2 < iVar1) {
        __assert_fail("returnsize <= size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                      ,0x183,"void string_buffer_appendf(string_buffer_t *, const char *, ...)");
      }
    }
    string_buffer_append_string(sb,__s);
    free(__s);
    return;
  }
  __assert_fail("sb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x16c,"void string_buffer_appendf(string_buffer_t *, const char *, ...)");
}

Assistant:

void string_buffer_appendf(string_buffer_t *sb, const char *fmt, ...)
{
    assert(sb != NULL);
    assert(fmt != NULL);

    int size = MIN_PRINTF_ALLOC;
    char *buf = malloc(size * sizeof(char));

    int returnsize;
    va_list args;

    va_start(args,fmt);
    returnsize = vsnprintf(buf, size, fmt, args);
    va_end(args);

    if (returnsize >= size) {
        // otherwise, we should try again
        free(buf);
        size = returnsize + 1;
        buf = malloc(size * sizeof(char));

        va_start(args, fmt);
        returnsize = vsnprintf(buf, size, fmt, args);
        va_end(args);

        assert(returnsize <= size);
    }

    string_buffer_append_string(sb, buf);
    free(buf);
}